

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

char * ipv4toa(uint32_t addr)

{
  uint32_t addr_local;
  
  sprintf(ipv4toa::rc,"%d.%d.%d.%d",(ulong)(addr >> 0x18),(ulong)(addr >> 0x10 & 0xff),
          (ulong)(addr >> 8 & 0xff),(ulong)(addr & 0xff));
  return ipv4toa::rc;
}

Assistant:

const char* ipv4toa(uint32_t addr)
{
    static char rc[20];
    sprintf(rc,
            "%d.%d.%d.%d",
            (addr >> 24) & 0xFF,
            (addr >> 16) & 0xFF,
            (addr >> 8) & 0xFF,
            (addr >> 0) & 0xFF);
    return rc;
}